

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::
read_chunked_transfer_encoded_chunk
          (ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
          *session,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *chunks_streambuf,
          unsigned_long length)

{
  bool bVar1;
  element_type *peVar2;
  char *__p;
  element_type *peVar3;
  element_type *peVar4;
  pointer pcVar5;
  element_type *peVar6;
  size_t sVar7;
  size_t __n;
  Response *this_00;
  element_type *this_01;
  error_code eVar8;
  undefined1 local_2e0 [8];
  ostream ostream;
  error_code local_1c8;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>
  local_1b8;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
  local_170;
  undefined1 local_160 [8];
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
  response;
  unique_ptr<char[],_std::default_delete<char[]>_> local_140;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  ostream tmp_stream;
  unsigned_long length_local;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *chunks_streambuf_local;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
  *session_local;
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this_local;
  
  peVar2 = std::
           __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
           get(&chunks_streambuf->
                super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  std::ostream::ostream(&buffer,&peVar2->super_streambuf);
  if (length != 0) {
    __p = (char *)operator_new__(length);
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&local_140,__p);
    peVar3 = std::
             __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)session);
    peVar4 = std::
             __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->request);
    pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_140);
    std::istream::read((char *)&peVar4->content,(long)pcVar5);
    pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_140);
    std::ostream::write((char *)&buffer,(long)pcVar5);
    peVar6 = std::
             __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)chunks_streambuf);
    sVar7 = asio::basic_streambuf<std::allocator<char>_>::size(peVar6);
    peVar6 = std::
             __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)chunks_streambuf);
    __n = asio::basic_streambuf<std::allocator<char>_>::max_size(peVar6);
    if (sVar7 == __n) {
      this_00 = (Response *)operator_new(0x170);
      std::
      shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
      ::shared_ptr(&local_170,session);
      Response::Response(this_00,&local_170,(this->config).timeout_content);
      std::
      shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Response>
      ::
      shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Response,void>
                ((shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Response>
                  *)local_160,this_00);
      std::
      shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
      ::~shared_ptr(&local_170);
      this_01 = std::
                __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_160);
      local_1a8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      local_1a8._M_h._M_rehash_policy._4_4_ = 0;
      local_1a8._M_h._M_rehash_policy._M_next_resize = 0;
      local_1a8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1a8._M_h._M_element_count = 0;
      local_1a8._M_h._M_buckets = (__buckets_ptr)0x0;
      local_1a8._M_h._M_bucket_count = 0;
      local_1a8._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_multimap(&local_1a8);
      Response::write(this_01,0x19d,&local_1a8,__n);
      std::
      unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SimpleWeb::CaseInsensitiveHash,_SimpleWeb::CaseInsensitiveEqual,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_multimap(&local_1a8);
      bVar1 = std::function::operator_cast_to_bool((function *)&this->on_error);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)session);
        std::
        shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>
        ::shared_ptr(&local_1b8,&peVar3->request);
        eVar8 = std::make_error_code(message_size);
        local_1c8._M_cat = eVar8._M_cat;
        local_1c8._M_value = eVar8._M_value;
        std::
        function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>,_const_std::error_code_&)>
        ::operator()(&this->on_error,&local_1b8,&local_1c8);
        std::
        shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>
        ::~shared_ptr(&local_1b8);
      }
      ostream._268_4_ = 1;
      std::
      shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
      ::~shared_ptr((shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
                     *)local_160);
    }
    else {
      ostream._268_4_ = 0;
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_140);
    if (ostream._268_4_ != 0) goto LAB_0015c2a5;
  }
  peVar3 = std::
           __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)session);
  std::
  __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&peVar3->request);
  std::istream::get();
  peVar3 = std::
           __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)session);
  std::
  __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&peVar3->request);
  std::istream::get();
  if (length == 0) {
    peVar6 = std::
             __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)chunks_streambuf);
    sVar7 = asio::basic_streambuf<std::allocator<char>_>::size(peVar6);
    if (sVar7 != 0) {
      peVar3 = std::
               __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)session);
      peVar4 = std::
               __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->request);
      std::ostream::ostream(local_2e0,(streambuf *)peVar4);
      peVar2 = std::
               __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ::get(&chunks_streambuf->
                      super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::ostream::operator<<(local_2e0,&peVar2->super_streambuf);
      std::ostream::~ostream(local_2e0);
    }
    find_resource(this,session);
  }
  else {
    read_chunked_transfer_encoded(this,session,chunks_streambuf);
  }
  ostream._268_4_ = 0;
LAB_0015c2a5:
  std::ostream::~ostream(&buffer);
  return;
}

Assistant:

void read_chunked_transfer_encoded_chunk(const std::shared_ptr<Session> &session, const std::shared_ptr<asio::streambuf> &chunks_streambuf, unsigned long length) {
      std::ostream tmp_stream(chunks_streambuf.get());
      if(length > 0) {
        std::unique_ptr<char[]> buffer(new char[length]);
        session->request->content.read(buffer.get(), static_cast<std::streamsize>(length));
        tmp_stream.write(buffer.get(), static_cast<std::streamsize>(length));
        if(chunks_streambuf->size() == chunks_streambuf->max_size()) {
          auto response = std::shared_ptr<Response>(new Response(session, this->config.timeout_content));
          response->write(StatusCode::client_error_payload_too_large);
          if(this->on_error)
            this->on_error(session->request, make_error_code::make_error_code(errc::message_size));
          return;
        }
      }

      // Remove "\r\n"
      session->request->content.get();
      session->request->content.get();

      if(length > 0)
        read_chunked_transfer_encoded(session, chunks_streambuf);
      else {
        if(chunks_streambuf->size() > 0) {
          std::ostream ostream(&session->request->streambuf);
          ostream << chunks_streambuf.get();
        }
        this->find_resource(session);
      }
    }